

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_functions_to_test.hpp
# Opt level: O2

void duckdb::udf_ternary_function<char*>(DataChunk *input,ExpressionState *state,Vector *result)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  reference pvVar4;
  reference vector;
  anon_union_16_2_67f50693_for_value *paVar5;
  void *__src;
  char *__dest;
  void *pvVar6;
  ulong row_idx;
  anon_union_16_2_67f50693_for_value aVar7;
  string_t target;
  
  duckdb::DataChunk::Flatten();
  duckdb::Vector::SetVectorType((VectorType)result);
  paVar5 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
  pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)input,2);
  lVar2 = *(long *)(pvVar4 + 0x20);
  pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)input,0);
  FlatVector::VerifyFlatVector(pvVar4);
  vector = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)input,2);
  FlatVector::VerifyFlatVector(vector);
  FlatVector::SetValidity(result,(ValidityMask *)(vector + 0x28));
  pvVar6 = (void *)(lVar2 + 4);
  for (row_idx = 0; row_idx < *(ulong *)(input + 0x18); row_idx = row_idx + 1) {
    bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)(pvVar4 + 0x28),row_idx);
    if (bVar3) {
      uVar1 = *(uint *)((long)pvVar6 + -4);
      aVar7 = (anon_union_16_2_67f50693_for_value)
              duckdb::StringVector::EmptyString(result,(ulong)uVar1);
      __dest = (char *)((long)&target.value + 4);
      if (0xc < aVar7.pointer.length) {
        __dest = aVar7.pointer.ptr;
      }
      __src = pvVar6;
      if (0xc < *(uint *)((long)pvVar6 + -4)) {
        __src = *(void **)((long)pvVar6 + 4);
      }
      target.value = aVar7;
      memcpy(__dest,__src,(ulong)uVar1);
      string_t::Finalize(&target);
      paVar5->pointer = (anon_struct_16_3_d7536bce_for_pointer)target.value;
    }
    pvVar6 = (void *)((long)pvVar6 + 0x10);
    paVar5 = paVar5 + 1;
  }
  return;
}

Assistant:

static void udf_ternary_function(DataChunk &input, ExpressionState &state, Vector &result) {
	input.Flatten();
	switch (GetTypeId<TYPE>()) {
	case PhysicalType::VARCHAR: {
		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<string_t>(result);
		auto ldata = FlatVector::GetData<string_t>(input.data[2]);
		auto &validity = FlatVector::Validity(input.data[0]);

		FlatVector::SetValidity(result, FlatVector::Validity(input.data[2]));

		for (idx_t i = 0; i < input.size(); i++) {
			if (!validity.RowIsValid(i)) {
				continue;
			}
			auto input_length = ldata[i].GetSize();
			string_t target = StringVector::EmptyString(result, input_length);
			auto target_data = target.GetDataWriteable();
			memcpy(target_data, ldata[i].GetData(), input_length);
			target.Finalize();
			result_data[i] = target;
		}
		break;
	}
	default: {
		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<TYPE>(result);
		auto ldata = FlatVector::GetData<TYPE>(input.data[2]);
		auto &mask = FlatVector::Validity(input.data[2]);
		FlatVector::SetValidity(result, mask);

		for (idx_t i = 0; i < input.size(); i++) {
			if (!mask.RowIsValid(i)) {
				continue;
			}
			result_data[i] = ldata[i];
		}
	}
	}
}